

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool LOADConvertLibraryPathWideStringToMultibyteString
               (LPCWSTR wideLibraryPath,LPSTR multibyteLibraryPath,
               INT *multibyteLibraryPathLengthRef)

{
  int iVar1;
  DWORD DVar2;
  size_t sVar3;
  DWORD dwLastError;
  size_t length;
  INT *multibyteLibraryPathLengthRef_local;
  LPSTR multibyteLibraryPath_local;
  LPCWSTR wideLibraryPath_local;
  
  if (multibyteLibraryPathLengthRef == (INT *)0x0) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0x4d7,"multibyteLibraryPathLengthRef != nullptr","");
    fflush(_stderr);
    abort();
  }
  if (wideLibraryPath != (LPCWSTR)0x0) {
    sVar3 = PAL_wcslen(wideLibraryPath);
    iVar1 = WideCharToMultiByte(0,0,wideLibraryPath,-1,multibyteLibraryPath,
                                ((int)sVar3 + 1) * MaxWCharToAcpLength,(LPCSTR)0x0,(LPBOOL)0x0);
    *multibyteLibraryPathLengthRef = iVar1;
    if (*multibyteLibraryPathLengthRef == 0) {
      DVar2 = GetLastError();
      if (DVar2 == 0x7a) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","LOADConvertLibraryPathWideStringToMultibyteString",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
                ,0x4e7);
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      }
      SetLastError(0x57);
      wideLibraryPath_local._7_1_ = false;
    }
    else {
      wideLibraryPath_local._7_1_ = true;
    }
    return wideLibraryPath_local._7_1_;
  }
  fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
          ,0x4d8,"wideLibraryPath != nullptr","");
  fflush(_stderr);
  abort();
}

Assistant:

static bool LOADConvertLibraryPathWideStringToMultibyteString(
    LPCWSTR wideLibraryPath,
    LPSTR multibyteLibraryPath,
    INT *multibyteLibraryPathLengthRef)
{
    _ASSERTE(multibyteLibraryPathLengthRef != nullptr);
    _ASSERTE(wideLibraryPath != nullptr);

    size_t length = (PAL_wcslen(wideLibraryPath)+1) * MaxWCharToAcpLength;
    *multibyteLibraryPathLengthRef = WideCharToMultiByte(CP_ACP, 0, wideLibraryPath, -1, multibyteLibraryPath,
                                                        length, nullptr, nullptr);

    if (*multibyteLibraryPathLengthRef == 0)
    {
        DWORD dwLastError = GetLastError();
        if (dwLastError == ERROR_INSUFFICIENT_BUFFER)
        {
            ERROR("wideLibraryPath converted to a multibyte string is longer than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
        }
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }
    return true;
}